

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O2

bool __thiscall dap::ContentReader::buffer(ContentReader *this,size_t bytes)

{
  deque<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  element_type *peVar1;
  size_type sVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  long lVar5;
  ulong uVar6;
  uint8_t chunk [256];
  value_type_conflict3 local_138 [264];
  
  this_00 = &this->buf;
  sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  if (sVar2 <= bytes) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    for (uVar6 = bytes - sVar2; uVar6 != 0; uVar6 = uVar6 - lVar3) {
      uVar4 = 0x100;
      if (uVar6 < 0x100) {
        uVar4 = uVar6;
      }
      peVar1 = (this->reader).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = (**(code **)((long)*peVar1 + 0x20))(peVar1,local_138,uVar4);
      if (lVar3 == 0) {
        return false;
      }
      for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (this_00,local_138 + lVar5);
      }
    }
  }
  return true;
}

Assistant:

bool ContentReader::buffer(size_t bytes) {
  if (bytes < buf.size()) {
    return true;
  }
  bytes -= buf.size();
  while (bytes > 0) {
    uint8_t chunk[256];
    auto numWant = std::min(sizeof(chunk), bytes);
    auto numGot = reader->read(chunk, numWant);
    if (numGot == 0) {
      return false;
    }
    for (size_t i = 0; i < numGot; i++) {
      buf.push_back(chunk[i]);
    }
    bytes -= numGot;
  }
  return true;
}